

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> * __thiscall
cmGeneratorTarget::GetSourceDepends(cmGeneratorTarget *this,cmSourceFile *sf)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  cmSourceFile *sf_local;
  cmGeneratorTarget *this_local;
  
  i._M_node = (_Base_ptr)sf;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
       ::find(&this->SourceDepends,(key_type *)&i);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
       ::end(&this->SourceDepends);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>
             ::operator->(&local_28);
    this_local = (cmGeneratorTarget *)&ppVar2->second;
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_local;
}

Assistant:

std::vector<cmSourceFile*> const* cmGeneratorTarget::GetSourceDepends(
  cmSourceFile const* sf) const
{
  SourceEntriesType::const_iterator i = this->SourceDepends.find(sf);
  if (i != this->SourceDepends.end()) {
    return &i->second.Depends;
  }
  return nullptr;
}